

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

void __thiscall ON_SubD::SwapDimple(ON_SubD *this,ON_SubDMeshImpl *subd_limple)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ON_SubDimple *__tmp;
  shared_ptr<ON_SubDimple> limple_sp;
  __shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&subd_limple->m_subdimple_wp);
  peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != local_28._M_ptr) {
    (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_28._M_ptr;
    p_Var2 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_28._M_refcount._M_pi;
    local_28._M_ptr = peVar1;
    local_28._M_refcount._M_pi = p_Var2;
    std::__weak_ptr<ON_SubDimple,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<ON_SubDimple,(__gnu_cxx::_Lock_policy)2> *)&subd_limple->m_subdimple_wp,
               &local_28);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

void ON_SubD::SwapDimple(class ON_SubDMeshImpl& subd_limple )
{
  std::shared_ptr <ON_SubDimple> limple_sp(subd_limple.m_subdimple_wp.lock());
  if (m_subdimple_sp.get() != limple_sp.get())
  {
    m_subdimple_sp.swap(limple_sp);
    subd_limple.m_subdimple_wp = limple_sp;
  }
}